

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

bool __thiscall
testing::internal::UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
          (UntypedFunctionMockerBase *this)

{
  int line;
  ExpectationBase *this_00;
  char *file;
  bool bVar1;
  ostream *poVar2;
  pointer plVar3;
  bool bVar4;
  stringstream ss;
  string local_1d8;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  plVar3 = (this->untyped_expectations_).
           super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = true;
  do {
    local_1b8._8_8_ =
         (this->untyped_expectations_).
         super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (plVar3 == (pointer)local_1b8._8_8_) {
      local_1b8._0_8_ =
           (this->untyped_expectations_).
           super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1a8 = (this->untyped_expectations_).
                  super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->untyped_expectations_).
      super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->untyped_expectations_).
      super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->untyped_expectations_).
      super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MutexBase::Unlock((MutexBase *)g_gmock_mutex);
      std::
      vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
      ::clear((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
               *)local_1b8);
      MutexBase::Lock((MutexBase *)g_gmock_mutex);
      std::
      vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
      ::~vector((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                 *)local_1b8);
      return bVar4;
    }
    this_00 = plVar3->value_;
    bVar1 = ExpectationBase::IsOverSaturated(this_00);
    if (bVar1) {
LAB_00177dfe:
      bVar4 = false;
    }
    else {
      bVar1 = ExpectationBase::IsSatisfied(this_00);
      if (!bVar1) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar2 = std::operator<<((ostream *)&local_1a8,"Actual function call count doesn\'t match ")
        ;
        poVar2 = std::operator<<(poVar2,(this_00->source_text_)._M_dataplus._M_p);
        std::operator<<(poVar2,"...\n");
        (*this_00->_vptr_ExpectationBase[2])(this_00,(ostream *)&local_1a8);
        ExpectationBase::DescribeCallCountTo(this_00,(ostream *)&local_1a8);
        file = this_00->file_;
        line = this_00->line_;
        std::__cxx11::stringbuf::str();
        Expect(false,file,line,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        goto LAB_00177dfe;
      }
    }
    plVar3 = plVar3 + 1;
  } while( true );
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  bool expectations_met = true;
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    ExpectationBase* const untyped_expectation = it->get();
    if (untyped_expectation->IsOverSaturated()) {
      // There was an upper-bound violation.  Since the error was
      // already reported when it occurred, there is no need to do
      // anything here.
      expectations_met = false;
    } else if (!untyped_expectation->IsSatisfied()) {
      expectations_met = false;
      ::std::stringstream ss;
      ss  << "Actual function call count doesn't match "
          << untyped_expectation->source_text() << "...\n";
      // No need to show the source file location of the expectation
      // in the description, as the Expect() call that follows already
      // takes care of it.
      untyped_expectation->MaybeDescribeExtraMatcherTo(&ss);
      untyped_expectation->DescribeCallCountTo(&ss);
      Expect(false, untyped_expectation->file(),
             untyped_expectation->line(), ss.str());
    }
  }

  // Deleting our expectations may trigger other mock objects to be deleted, for
  // example if an action contains a reference counted smart pointer to that
  // mock object, and that is the last reference. So if we delete our
  // expectations within the context of the global mutex we may deadlock when
  // this method is called again. Instead, make a copy of the set of
  // expectations to delete, clear our set within the mutex, and then clear the
  // copied set outside of it.
  UntypedExpectations expectations_to_delete;
  untyped_expectations_.swap(expectations_to_delete);

  g_gmock_mutex.Unlock();
  expectations_to_delete.clear();
  g_gmock_mutex.Lock();

  return expectations_met;
}